

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

int ShCompile(ShHandle handle,char **shaderStrings,int numStrings,int *inputLengths,
             EShOptimizationLevel optLevel,TBuiltInResource *resources,int param_7,
             int defaultVersion,bool forwardCompatible,EShMessages messages,char *shaderFileName)

{
  TInfoSink *pTVar1;
  string sourceEntryPointName;
  bool bVar2;
  int iVar3;
  uint uVar4;
  TCompiler *compiler;
  undefined4 extraout_var;
  TPoolAllocator *this;
  undefined8 uVar5;
  TEnvironment *in_stack_fffffffffffff7a8;
  ForbidIncluder includer;
  string local_838 [32];
  TIntermediate intermediate;
  
  uVar4 = 0;
  if (handle != (ShHandle)0x0) {
    compiler = (TCompiler *)(**(code **)(*handle + 0x10))();
    if (compiler != (TCompiler *)0x0) {
      iVar3 = (*(compiler->super_TShHandleBase)._vptr_TShHandleBase[5])(compiler);
      glslang::SetThreadPoolAllocator((TPoolAllocator *)CONCAT44(extraout_var,iVar3));
      glslang::TInfoSinkBase::erase(&compiler->infoSink->info);
      glslang::TInfoSinkBase::erase(&compiler->infoSink->debug);
      pTVar1 = compiler->infoSink;
      (pTVar1->info).shaderFileName = shaderFileName;
      (pTVar1->debug).shaderFileName = shaderFileName;
      uVar4 = 0;
      glslang::TIntermediate::TIntermediate(&intermediate,compiler->language,0,ENoProfile);
      includer.super_Includer._vptr_Includer = (Includer)&PTR_includeSystem_00899180;
      uVar5 = 0x2e3ed2;
      std::__cxx11::string::string<std::allocator<char>>
                (local_838,"",(allocator<char> *)&stack0xfffffffffffff7af);
      sourceEntryPointName.field_2._8_8_ = uVar5;
      sourceEntryPointName._0_24_ = ZEXT824(local_838);
      bVar2 = anon_unknown.dwarf_7f0079::CompileDeferred
                        (compiler,shaderStrings,numStrings,inputLengths,(char **)0x0,"",optLevel,
                         resources,defaultVersion,ENoProfile,false,0,forwardCompatible,messages,
                         &intermediate,&includer.super_Includer,sourceEntryPointName,
                         in_stack_fffffffffffff7a8,SUB81(resources,0));
      std::__cxx11::string::_M_dispose();
      if (bVar2) {
        uVar4 = 1;
        if (optLevel != EShOptNoGeneration && intermediate.treeRoot != (TIntermNode *)0x0) {
          uVar4 = (*(compiler->super_TShHandleBase)._vptr_TShHandleBase[7])
                            (compiler,intermediate.treeRoot,(ulong)(uint)intermediate.version,
                             (ulong)intermediate.profile);
          uVar4 = uVar4 & 0xff;
        }
      }
      glslang::TIntermediate::removeTree(&intermediate);
      this = glslang::GetThreadPoolAllocator();
      glslang::TPoolAllocator::pop(this);
      glslang::TIntermediate::~TIntermediate(&intermediate);
    }
  }
  return uVar4;
}

Assistant:

int ShCompile(
    const ShHandle handle,
    const char* const shaderStrings[],
    const int numStrings,
    const int* inputLengths,
    const EShOptimizationLevel optLevel,
    const TBuiltInResource* resources,
    int /*debugOptions*/,
    int defaultVersion,        // use 100 for ES environment, 110 for desktop
    bool forwardCompatible,    // give errors for use of deprecated features
    EShMessages messages,       // warnings/errors/AST; things to print out,
    const char *shaderFileName // the filename
    )
{
    // Map the generic handle to the C++ object
    if (handle == nullptr)
        return 0;

    TShHandleBase* base = reinterpret_cast<TShHandleBase*>(handle);
    TCompiler* compiler = base->getAsCompiler();
    if (compiler == nullptr)
        return 0;

    SetThreadPoolAllocator(compiler->getPool());

    compiler->infoSink.info.erase();
    compiler->infoSink.debug.erase();
    compiler->infoSink.info.setShaderFileName(shaderFileName);
    compiler->infoSink.debug.setShaderFileName(shaderFileName);


    TIntermediate intermediate(compiler->getLanguage());
    TShader::ForbidIncluder includer;
    bool success = CompileDeferred(compiler, shaderStrings, numStrings, inputLengths, nullptr,
                                   "", optLevel, resources, defaultVersion, ENoProfile, false, 0,
                                   forwardCompatible, messages, intermediate, includer);

    //
    // Call the machine dependent compiler
    //
    if (success && intermediate.getTreeRoot() && optLevel != EShOptNoGeneration)
        success = compiler->compile(intermediate.getTreeRoot(), intermediate.getVersion(), intermediate.getProfile());

    intermediate.removeTree();

    // Throw away all the temporary memory used by the compilation process.
    // The push was done in the CompileDeferred() call above.
    GetThreadPoolAllocator().pop();

    return success ? 1 : 0;
}